

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O3

int fl_utf_strncasecmp(char *s1,char *s2,int n)

{
  uint ucs;
  uint ucs_00;
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  int l2;
  int l1;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (0 < n) {
    do {
      if ((*s1 == '\0') && (*s2 == '\0')) {
        return 0;
      }
      ucs = fl_utf8decode(s1,(char *)0x0,(wchar_t *)((long)&local_38 + 4));
      ucs_00 = fl_utf8decode(s2,(char *)0x0,(wchar_t *)&local_38);
      iVar1 = XUtf8Tolower(ucs);
      iVar2 = XUtf8Tolower(ucs_00);
      if (iVar1 - iVar2 != 0) {
        return iVar1 - iVar2;
      }
      s2 = s2 + (wchar_t)local_38;
      s1 = s1 + local_38._4_4_;
      n = n + -1;
    } while (n != 0);
  }
  return 0;
}

Assistant:

int fl_utf_strncasecmp(const char *s1, const char *s2, int n)
{
  int i;
  for (i = 0; i < n; i++) {
    int l1, l2;
    unsigned int u1, u2;

    if (*s1==0 && *s2==0) return 0; // all compared equal, return 0

    u1 = fl_utf8decode(s1, 0, &l1);
    u2 = fl_utf8decode(s2, 0, &l2);
    int res = XUtf8Tolower(u1) - XUtf8Tolower(u2);
    if (res) return res;
    s1 += l1;
    s2 += l2;
  }
  return 0;
}